

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr3r540.cpp
# Opt level: O1

void IKSolver::polyroots4(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [8];
  double *pdVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  long lVar13;
  int i;
  long lVar14;
  double dVar15;
  double dVar16;
  bool visited [4];
  IkReal err [4];
  complex<double> coeffs [4];
  double local_128;
  double local_120;
  undefined1 local_118 [24];
  IkReal *local_100;
  int *local_f8;
  double local_f0;
  double local_e8;
  undefined1 local_e0 [8];
  double local_d8 [4];
  double local_b8 [10];
  undefined1 local_68 [8];
  double adStack_60 [6];
  
  dVar1 = *rawcoeffs;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    polyroots3(rawcoeffs + 1,rawroots,numroots);
    return;
  }
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  lVar4 = 0;
  do {
    *(double *)((long)local_b8 + lVar4 * 2) = *(double *)((long)rawcoeffs + lVar4 + 8) / dVar1;
    *(undefined8 *)((long)local_b8 + lVar4 * 2 + 8) = 0;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  adStack_60[3] = 0.0;
  adStack_60[4] = 0.0;
  adStack_60[1] = 0.0;
  adStack_60[2] = 0.0;
  local_b8[8] = 1.0;
  local_b8[9] = 0.0;
  local_68 = (undefined1  [8])0x3fd999999999999a;
  adStack_60[0] = 0.9;
  local_d8[0] = 1.0;
  local_d8[1] = 1.0;
  lVar4 = 0x14;
  local_100 = rawroots;
  local_f8 = numroots;
  do {
    local_118._0_8_ = *(double *)((long)local_b8 + lVar4 * 2 + 0x28);
    local_118._8_8_ = *(undefined8 *)(local_68 + lVar4 * 2 + -0x20);
    std::complex<double>::operator*=((complex<double> *)local_118,(complex<double> *)local_68);
    *(undefined8 *)(local_68 + lVar4 * 2 + -0x18) = local_118._0_8_;
    *(undefined8 *)(local_68 + lVar4 * 2 + -0x10) = local_118._8_8_;
    *(undefined8 *)((long)local_d8 + lVar4 + -4) = 0x3ff0000000000000;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x24);
  local_e8 = local_b8[0];
  local_f0 = local_b8[1];
  auVar8 = (undefined1  [8])0x0;
  do {
    lVar4 = 0;
    lVar14 = 0;
    bVar3 = false;
    local_e0 = auVar8;
    do {
      if (2.842170943040401e-14 <= local_d8[lVar14]) {
        lVar5 = lVar14 * 0x10;
        pdVar9 = (double *)(local_68 + lVar5 + -0x10);
        local_128 = *pdVar9 + local_e8;
        local_120 = *(double *)(local_68 + lVar5 + -8) + local_f0;
        lVar13 = 0;
        do {
          local_118._0_8_ = *pdVar9;
          local_118._8_8_ = *(undefined8 *)(local_68 + lVar5 + -8);
          std::complex<double>::operator*=
                    ((complex<double> *)local_118,(complex<double> *)&local_128);
          local_128 = (double)local_118._0_8_ + *(double *)((long)local_b8 + lVar13 + 0x10);
          local_120 = (double)local_118._8_8_ + *(double *)((long)local_b8 + lVar13 + 0x18);
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x30);
        lVar13 = 0;
        do {
          if (lVar4 != lVar13) {
            dVar1 = *pdVar9;
            dVar2 = *(double *)(local_68 + lVar5 + -8);
            dVar15 = *(double *)((long)local_b8 + lVar13 + 0x40);
            dVar16 = *(double *)((long)local_b8 + lVar13 + 0x48);
            if ((dVar1 == dVar15) && (!NAN(dVar1) && !NAN(dVar15))) {
              if ((dVar2 == dVar16) && (!NAN(dVar2) && !NAN(dVar16))) goto LAB_00132d34;
            }
            local_128 = (double)__divdc3(SUB84(local_128,0),local_120,dVar1 - dVar15,dVar2 - dVar16)
            ;
          }
LAB_00132d34:
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x40);
        *pdVar9 = *pdVar9 - local_128;
        *(double *)(local_68 + lVar5 + -8) = *(double *)(local_68 + lVar5 + -8) - local_120;
        dVar1 = cabs(local_128);
        local_d8[lVar14] = dVar1;
        bVar3 = true;
        auVar8 = local_e0;
      }
      lVar14 = lVar14 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar14 != 4);
    if ((!bVar3) ||
       (uVar7 = SUB84(auVar8,0) + 1, auVar8 = (undefined1  [8])(ulong)uVar7, uVar7 == 0x6e)) {
      uVar6 = 0;
      *local_f8 = 0;
      local_118._0_8_ = local_118._0_8_ & 0xffffffff00000000;
      lVar4 = 1;
      pdVar9 = adStack_60;
      iVar10 = 0;
      do {
        if (local_118[uVar6] == '\0') {
          dVar1 = *(double *)(local_68 + uVar6 * 0x10 + -0x10);
          dVar2 = *(double *)(local_68 + uVar6 * 0x10 + -8);
          iVar11 = 1;
          pdVar12 = pdVar9;
          lVar14 = lVar4;
          dVar15 = dVar1;
          dVar16 = dVar2;
          if (uVar6 < 3) {
            do {
              if ((ABS(dVar1 - pdVar12[-1]) < 1.4901161193847656e-08) &&
                 (ABS(dVar2 - *pdVar12) < 0.002)) {
                dVar15 = dVar15 + pdVar12[-1];
                dVar16 = dVar16 + *pdVar12;
                iVar11 = iVar11 + 1;
                local_118[lVar14] = 1;
              }
              lVar14 = lVar14 + 1;
              pdVar12 = pdVar12 + 2;
            } while (lVar14 != 4);
          }
          if (1 < iVar11) {
            dVar16 = dVar16 / (double)iVar11;
          }
          if (ABS(dVar16) < 1.4901161193847656e-08) {
            if (1 < iVar11) {
              dVar15 = dVar15 / (double)iVar11;
            }
            lVar14 = (long)iVar10;
            iVar10 = iVar10 + 1;
            *local_f8 = iVar10;
            local_100[lVar14] = dVar15;
          }
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 1;
        pdVar9 = pdVar9 + 2;
      } while (uVar6 != 4);
      return;
    }
  } while( true );
}

Assistant:

static inline void polyroots4(IkReal rawcoeffs[4+1], IkReal rawroots[4], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots3(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[4];
    const int maxsteps = 110;
    for(int i = 0; i < 4; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[4];
    IkReal err[4];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 4; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 4; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 4; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 4; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[4] = {false};
    for(int i = 0; i < 4; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 4; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}